

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed-animatable.cc
# Opt level: O2

bool tinyusdz::tydra::
     EvaluateTypedAnimatableAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
               (Stage *stage,
               TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
               *tattr,string *attr_name,
               vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
               *value_out,string *err,double t,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  ostringstream ss_e;
  TerminalAttributeValue value_1;
  allocator local_5b1;
  double local_5b0;
  string local_5a8;
  allocator local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  undefined1 local_528 [32];
  undefined8 local_508;
  string local_500;
  undefined7 local_4ff;
  undefined1 uStack_4f8;
  undefined8 uStack_4f7;
  bool local_4c8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_4a0;
  AttrMetas local_488;
  TerminalAttributeValue local_280;
  
  if (value_out ==
      (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    poVar4 = ::std::operator<<((ostream *)local_528,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed-animatable.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"EvaluateTypedAnimatableAttribute");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd4);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_528,"`value_out` param is nullptr.");
    ::std::operator<<(poVar4,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
  }
  else if (tattr->_blocked == true) {
joined_r0x0040496a:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)tinterp;
    local_5b0 = t;
    if ((tattr->_attrib).has_value_ == true) {
      uStack_4f8 = 0;
      uStack_4f7 = 0;
      local_508 = (pointer)0x0;
      local_500 = (string)0x0;
      local_4ff = 0;
      local_528._0_8_ = (pointer)0x0;
      local_528._8_2_ = 0;
      local_528._10_6_ = 0;
      local_528._16_2_ = 0;
      local_528._18_8_ = 0;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out;
      bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              ::get_value(tattr,(Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                                 *)local_528);
      if (bVar1) {
        bVar2 = Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                ::get((Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                       *)local_528,local_5b0,value_out,tinterp);
        tattr = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                 *)0x1;
        if (!bVar2) {
          if (err != (string *)0x0) {
            ::std::__cxx11::string::string
                      ((string *)&local_5a8,"Failed to get TypedAnimatableAttribute value: {} \n",
                       local_588);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_280,(fmt *)&local_5a8,(string *)attr_name,args);
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          tattr = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                   *)0x0;
        }
      }
      bVar3 = (byte)tattr;
      Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
      ::~Animatable((Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                     *)local_528);
      if (bVar1) goto LAB_00404827;
    }
    else {
      if ((tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        Attribute::Attribute((Attribute *)local_528);
        if (tattr->_blocked == true) {
          local_4c8 = true;
          local_508 = (pointer)((ulong)local_508 & 0xffffffff00000000);
        }
        else {
          bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                  ::is_value_empty(tattr);
          if (((bVar1) ||
              ((tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_finish ==
               (tattr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_start)) ||
             (((tattr->_attrib).has_value_ & 1U) != 0)) {
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign(&local_500);
            ::std::__cxx11::string::_M_dispose();
            local_508 = (pointer)((ulong)local_508._4_4_ << 0x20);
          }
          else {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&local_4a0,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&tattr->_paths);
          }
        }
        AttrMetas::operator=(&local_488,&tattr->_metas);
        TerminalAttributeValue::TerminalAttributeValue(&local_280);
        bVar3 = EvaluateAttribute(stage,(Attribute *)local_528,attr_name,&local_280,err,local_5b0,
                                  tinterp);
        if ((bool)bVar3) {
          __x = TerminalAttributeValue::
                as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                          (&local_280);
          if (__x == (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)0x0) {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::string
                        ((string *)local_588,
                         "Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}"
                         ,&local_5b1);
              TerminalAttributeValue::type_name_abi_cxx11_(&local_548,&local_280);
              tinyusdz::value::
              TypeTraits<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
              ::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (&local_5a8,(fmt *)local_588,&local_548,&local_568,attr_name,args_2);
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            TerminalAttributeValue::~TerminalAttributeValue(&local_280);
            Attribute::~Attribute((Attribute *)local_528);
            goto LAB_00404824;
          }
          ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
          operator=(value_out,__x);
        }
        TerminalAttributeValue::~TerminalAttributeValue(&local_280);
        Attribute::~Attribute((Attribute *)local_528);
        goto LAB_00404827;
      }
      bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              ::is_value_empty(tattr);
      if (bVar1) goto joined_r0x0040496a;
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string
                  ((string *)&local_280,"[Internal error] Invalid TypedAttribute? : {} \n",
                   (allocator *)&local_5a8);
        fmt::format<std::__cxx11::string>
                  ((string *)local_528,(fmt *)&local_280,(string *)attr_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
    }
  }
LAB_00404824:
  bVar3 = 0;
LAB_00404827:
  return (bool)(bVar3 & 1);
}

Assistant:

bool EvaluateTypedAnimatableAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<Animatable<T>> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err,
    const double t,
    const value::TimeSampleInterpolationType tinterp) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  // Eval order:
  // - ValueBlocked?
  // - has value?(default value or timesamped value)
  // - has connection?

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.has_value()) {
    Animatable<T> value;
    if (tattr.get_value(&value)) {
      if (value.get(t, value_out, tinterp)) {
        return true;
      } else {
        if (err) {
          (*err) += fmt::format("Failed to get TypedAnimatableAttribute value: {} \n", attr_name);
        }
        return false;
      }
    }
  } else if (tattr.has_connections()) {

    // Follow targetPath
    Attribute attr = ToAttributeConnection(tattr);

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 t, tinterp);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}", value.type_name(), value::TypeTraits<T>::type_name(), attr_name);
    }

  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else {
    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}